

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  float *pfVar7;
  void *pvVar8;
  long *plVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  Layer *pLVar14;
  long lVar15;
  int iVar16;
  void *pvVar17;
  ulong uVar18;
  uint _w;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  float fVar26;
  vector<int,_std::allocator<int>_> _space_ofs;
  ParamDict pd;
  void *local_b20;
  long local_b18;
  ModelBinFromMatArray local_ac0;
  undefined8 local_ab0;
  undefined4 local_aa8;
  long *local_aa0;
  undefined4 local_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined8 local_a88;
  void *local_a80;
  long local_a78;
  long local_a70;
  ulong local_a68;
  ulong local_a60;
  void *local_a58;
  long local_a50;
  void *local_a48;
  void *local_a40;
  Mat local_a38;
  void *local_9f8;
  int *piStack_9f0;
  size_t local_9e8;
  int local_9e0;
  Allocator *local_9d8;
  int local_9d0;
  int iStack_9cc;
  int iStack_9c8;
  int iStack_9c4;
  size_t local_9c0;
  void *local_9b8;
  int *piStack_9b0;
  size_t local_9a8;
  int local_9a0;
  Allocator *local_998;
  undefined8 local_990;
  undefined8 uStack_988;
  size_t local_980;
  float *local_978;
  Mat *pMStack_970;
  undefined8 uStack_968;
  undefined4 uStack_960;
  long *local_958;
  undefined4 local_950;
  undefined4 uStack_94c;
  undefined4 uStack_948;
  undefined4 uStack_944;
  undefined8 local_940;
  undefined1 local_938 [32];
  Allocator *local_918;
  Allocator *pAStack_910;
  int iStack_90c;
  undefined8 local_908;
  size_t asStack_900 [282];
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar10 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar10;
  }
  iVar10 = this->kernel_w;
  iVar1 = this->kernel_h;
  if ((iVar1 == 1 && (iVar10 == 1 && bottom_blob->dims == 1)) &&
     (bottom_blob->w == this->weight_data_size / this->num_output)) {
    pLVar14 = create_layer(0xf);
    ParamDict::ParamDict((ParamDict *)local_938);
    ParamDict::set((ParamDict *)local_938,0,this->num_output);
    ParamDict::set((ParamDict *)local_938,1,this->bias_term);
    ParamDict::set((ParamDict *)local_938,2,this->weight_data_size);
    ParamDict::set((ParamDict *)local_938,8,this->int8_scale_term);
    (*pLVar14->_vptr_Layer[2])(pLVar14,local_938);
    lVar15 = 0;
    do {
      *(undefined8 *)((long)&local_a38.refcount + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_a38.elemsize + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_a38.data + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.refcount + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.allocator + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.dims + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.h + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.cstep + lVar15) = 0;
      lVar15 = lVar15 + 0x40;
    } while (lVar15 != 0x100);
    if (&local_a38 != &this->weight_data) {
      piVar4 = (this->weight_data).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      if (local_a38.refcount != (int *)0x0) {
        LOCK();
        *local_a38.refcount = *local_a38.refcount + -1;
        UNLOCK();
        if (*local_a38.refcount == 0) {
          if (local_a38.allocator == (Allocator *)0x0) {
            if (local_a38.data != (void *)0x0) {
              free(local_a38.data);
            }
          }
          else {
            (**(code **)(*(long *)local_a38.allocator + 0x18))();
          }
        }
      }
      local_a38.data = (this->weight_data).data;
      local_a38.refcount = (this->weight_data).refcount;
      local_a38.elemsize = (this->weight_data).elemsize;
      local_a38.elempack = (this->weight_data).elempack;
      local_a38.allocator = (this->weight_data).allocator;
      local_a38.dims = (this->weight_data).dims;
      local_a38.w = (this->weight_data).w;
      local_a38.h = (this->weight_data).h;
      local_a38.c = (this->weight_data).c;
      local_a38.cstep = (this->weight_data).cstep;
    }
    if ((Mat *)&local_9f8 != &this->bias_data) {
      piVar4 = (this->bias_data).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      if (piStack_9f0 != (int *)0x0) {
        LOCK();
        *piStack_9f0 = *piStack_9f0 + -1;
        UNLOCK();
        if (*piStack_9f0 == 0) {
          if (local_9d8 == (Allocator *)0x0) {
            if (local_9f8 != (void *)0x0) {
              free(local_9f8);
            }
          }
          else {
            (**(code **)(*(long *)local_9d8 + 0x18))();
          }
        }
      }
      local_9f8 = (this->bias_data).data;
      piStack_9f0 = (this->bias_data).refcount;
      local_9e8 = (this->bias_data).elemsize;
      local_9e0 = (this->bias_data).elempack;
      local_9d8 = (this->bias_data).allocator;
      local_9d0 = (this->bias_data).dims;
      iStack_9cc = (this->bias_data).w;
      iStack_9c8 = (this->bias_data).h;
      iStack_9c4 = (this->bias_data).c;
      local_9c0 = (this->bias_data).cstep;
    }
    if (this->int8_scale_term != 0) {
      if ((Mat *)&local_9b8 != &this->weight_data_int8_scales) {
        piVar4 = (this->weight_data_int8_scales).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        if (piStack_9b0 != (int *)0x0) {
          LOCK();
          *piStack_9b0 = *piStack_9b0 + -1;
          UNLOCK();
          if (*piStack_9b0 == 0) {
            if (local_998 == (Allocator *)0x0) {
              if (local_9b8 != (void *)0x0) {
                free(local_9b8);
              }
            }
            else {
              (**(code **)(*(long *)local_998 + 0x18))();
            }
          }
        }
        local_9b8 = (this->weight_data_int8_scales).data;
        piStack_9b0 = (this->weight_data_int8_scales).refcount;
        local_9a8 = (this->weight_data_int8_scales).elemsize;
        local_9a0 = (this->weight_data_int8_scales).elempack;
        local_998 = (this->weight_data_int8_scales).allocator;
        local_990._0_4_ = (this->weight_data_int8_scales).dims;
        local_990._4_4_ = (this->weight_data_int8_scales).w;
        uStack_988._0_4_ = (this->weight_data_int8_scales).h;
        uStack_988._4_4_ = (this->weight_data_int8_scales).c;
        local_980 = (this->weight_data_int8_scales).cstep;
      }
      local_ac0.super_ModelBin._vptr_ModelBin = (_func_int **)&this->bottom_blob_int8_scale;
      local_ac0.weights = (Mat *)0x0;
      local_ab0 = 4;
      local_aa8 = 1;
      local_aa0 = (long *)0x0;
      local_a98 = 2;
      uStack_a94 = 1;
      uStack_a90 = 4;
      uStack_a8c = 1;
      local_a88 = 4;
      if (pMStack_970 != (Mat *)0x0) {
        LOCK();
        *(int *)&pMStack_970->data = *(int *)&pMStack_970->data + -1;
        UNLOCK();
        if (*(int *)&pMStack_970->data == 0) {
          if (local_958 == (long *)0x0) {
            if (local_978 != (float *)0x0) {
              free(local_978);
            }
          }
          else {
            (**(code **)(*local_958 + 0x18))();
          }
        }
      }
      local_978 = (float *)local_ac0.super_ModelBin._vptr_ModelBin;
      pMStack_970 = local_ac0.weights;
      uStack_968 = local_ab0;
      uStack_960 = local_aa8;
      local_958 = local_aa0;
      local_950 = local_a98;
      uStack_94c = uStack_a94;
      uStack_948 = uStack_a90;
      uStack_944 = uStack_a8c;
      local_940 = local_a88;
      if (local_ac0.weights != (Mat *)0x0) {
        LOCK();
        *(int *)&(local_ac0.weights)->data = *(int *)&(local_ac0.weights)->data + -1;
        UNLOCK();
        if (*(int *)&(local_ac0.weights)->data == 0) {
          if (local_aa0 == (long *)0x0) {
            if (local_ac0.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
              free(local_ac0.super_ModelBin._vptr_ModelBin);
            }
          }
          else {
            (**(code **)(*local_aa0 + 0x18))();
          }
        }
      }
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_ac0,&local_a38);
    (*pLVar14->_vptr_Layer[3])(pLVar14,&local_ac0);
    ModelBin::~ModelBin(&local_ac0.super_ModelBin);
    (*pLVar14->_vptr_Layer[4])(pLVar14,opt);
    (*pLVar14->_vptr_Layer[7])(pLVar14,bottom_blob,top_blob,opt);
    (*pLVar14->_vptr_Layer[1])(pLVar14);
    lVar15 = 0xc0;
    do {
      piVar4 = *(int **)((long)&local_a38.refcount + lVar15);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar8 = *(void **)((long)&local_a38.data + lVar15);
          plVar9 = *(long **)((long)&local_a38.allocator + lVar15);
          if (plVar9 == (long *)0x0) {
            if (pvVar8 != (void *)0x0) {
              free(pvVar8);
            }
          }
          else {
            (**(code **)(*plVar9 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_a38.refcount + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_a38.elemsize + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_a38.data + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.refcount + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.dims + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.h + lVar15) = 0;
      *(undefined8 *)((long)&local_a38.cstep + lVar15) = 0;
      lVar15 = lVar15 + -0x40;
    } while (lVar15 != -0x40);
    lVar15 = 0x8c0;
    do {
      piVar4 = *(int **)(local_938 + lVar15 + 8);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (*(long **)((long)&local_918 + lVar15) == (long *)0x0) {
            if (*(void **)(local_938 + lVar15) != (void *)0x0) {
              free(*(void **)(local_938 + lVar15));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar15) + 0x18))();
          }
        }
      }
      *(undefined8 *)(local_938 + lVar15 + 0xc) = 0;
      *(undefined8 *)(local_938 + lVar15 + 0x14) = 0;
      *(undefined8 *)(local_938 + lVar15) = 0;
      *(undefined8 *)(local_938 + lVar15 + 8) = 0;
      *(undefined8 *)((long)&stack0xfffffffffffff6f0 + lVar15) = 0;
      *(undefined8 *)((long)asStack_900 + lVar15 + -8) = 0;
      *(undefined8 *)((long)asStack_900 + lVar15) = 0;
      lVar15 = lVar15 + -0x48;
    } while (lVar15 != -0x40);
    iVar23 = 0;
  }
  else {
    uVar2 = bottom_blob->c;
    sVar5 = bottom_blob->elemsize;
    iVar3 = this->dilation_w;
    iVar19 = this->dilation_h;
    local_938._16_4_ = 0;
    local_938._20_4_ = 0;
    local_938._24_4_ = 0;
    local_938._0_8_ = (void *)0x0;
    local_938._8_4_ = 0;
    local_938._12_4_ = 0;
    local_918 = (Allocator *)0x0;
    pAStack_910 = (Allocator *)0x0;
    local_908._0_4_ = 0;
    local_908._4_4_ = 0;
    asStack_900[0] = 0;
    make_padding(this,bottom_blob,(Mat *)local_938,opt);
    iVar23 = -100;
    if (((void *)local_938._0_8_ != (void *)0x0) && ((long)local_908._4_4_ * asStack_900[0] != 0)) {
      iVar23 = iStack_90c;
      uVar22 = (long)(~((iVar10 + -1) * iVar3) + iStack_90c) / (long)this->stride_w;
      uVar24 = uVar22 & 0xffffffff;
      iVar1 = (~((iVar1 + -1) * iVar19) + (int)local_908) / this->stride_h;
      uVar11 = this->kernel_w * this->kernel_h;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_a38,(long)(int)uVar11,
                 (allocator_type *)&local_ac0);
      pvVar8 = local_a38.data;
      _w = (int)uVar22 + 1;
      iVar10 = this->kernel_h;
      if (0 < iVar10) {
        iVar3 = this->dilation_h;
        iVar19 = this->kernel_w;
        iVar12 = this->dilation_w * iVar19;
        iVar13 = 0;
        iVar16 = 0;
        iVar21 = 0;
        do {
          if (0 < iVar19) {
            lVar15 = 0;
            do {
              *(int *)((long)local_a38.data + (iVar16 + lVar15) * 4) = iVar21;
              iVar21 = iVar21 + this->dilation_w;
              iVar19 = this->kernel_w;
              lVar15 = lVar15 + 1;
            } while ((int)lVar15 < iVar19);
            iVar16 = iVar16 + (int)lVar15;
            iVar10 = this->kernel_h;
          }
          iVar21 = iVar21 + (iVar23 * iVar3 - iVar12);
          iVar13 = iVar13 + 1;
        } while (iVar13 < iVar10);
      }
      Mat::create(top_blob,_w,iVar1 + 1,this->num_output,sVar5,opt->blob_allocator);
      local_a80 = top_blob->data;
      iVar23 = -100;
      if ((local_a80 != (void *)0x0) && (sVar5 = top_blob->cstep, (long)top_blob->c * sVar5 != 0)) {
        local_a78 = (long)this->num_output;
        if (0 < local_a78) {
          sVar6 = top_blob->elemsize;
          local_a70 = (long)(int)_w;
          uVar22 = (ulong)_w;
          iVar10 = 0;
          local_b18 = 0;
          local_a68 = uVar24;
          local_a60 = uVar22;
          do {
            if (-1 < iVar1) {
              local_b20 = (void *)(sVar5 * sVar6 * local_b18 + (long)local_a80);
              iVar3 = this->bias_term;
              iVar19 = this->activation_type;
              local_a58 = (void *)((long)iVar10 * 4 + (long)(this->weight_data).data);
              iVar23 = 0;
              do {
                if (-1 < (int)uVar24) {
                  pfVar7 = (float *)(this->activation_params).data;
                  local_a40 = (this->bias_data).data;
                  lVar15 = asStack_900[0] * CONCAT44(local_938._20_4_,local_938._16_4_);
                  local_a48 = (void *)((long)(iStack_90c * iVar23 * this->stride_h) *
                                       CONCAT44(local_938._20_4_,local_938._16_4_) + local_938._0_8_
                                      );
                  local_a50 = (long)this->stride_w;
                  uVar24 = 0;
                  do {
                    if (iVar3 == 0) {
                      fVar26 = 0.0;
                    }
                    else {
                      fVar26 = *(float *)((long)local_a40 + local_b18 * 4);
                    }
                    if (0 < (int)uVar2) {
                      uVar18 = 0;
                      pvVar17 = local_a58;
                      do {
                        if (0 < (int)uVar11) {
                          uVar20 = 0;
                          do {
                            fVar26 = fVar26 + *(float *)((long)pvVar17 + uVar20 * 4) *
                                              *(float *)((long)local_a48 +
                                                        (long)*(int *)((long)pvVar8 + uVar20 * 4) *
                                                        4 + lVar15 * uVar18 + uVar24 * local_a50 * 4
                                                        );
                            uVar20 = uVar20 + 1;
                          } while (uVar11 != uVar20);
                        }
                        uVar18 = uVar18 + 1;
                        pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar11 * 4);
                      } while (uVar18 != uVar2);
                    }
                    switch(iVar19) {
                    case 1:
                      if (fVar26 <= 0.0) {
                        fVar26 = 0.0;
                      }
                      break;
                    case 2:
                      fVar26 = fVar26 * (float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar7 |
                                               -(uint)(0.0 < fVar26) & 0x3f800000);
                      break;
                    case 3:
                      if (fVar26 <= *pfVar7) {
                        fVar26 = *pfVar7;
                      }
                      if (pfVar7[1] < fVar26) {
                        fVar26 = pfVar7[1];
                      }
                      break;
                    case 4:
                      fVar26 = expf(-fVar26);
                      uVar22 = local_a60;
                      fVar26 = 1.0 / (fVar26 + 1.0);
                    }
                    *(float *)((long)local_b20 + uVar24 * 4) = fVar26;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar22);
                }
                local_b20 = (void *)((long)local_b20 + local_a70 * 4);
                bVar25 = iVar23 != iVar1;
                uVar24 = local_a68;
                iVar23 = iVar23 + 1;
              } while (bVar25);
            }
            local_b18 = local_b18 + 1;
            iVar10 = iVar10 + uVar2 * uVar11;
          } while (local_b18 != local_a78);
        }
        iVar23 = 0;
      }
      if (local_a38.data != (void *)0x0) {
        operator_delete(local_a38.data,local_a38.elemsize - (long)local_a38.data);
      }
    }
    piVar4 = (int *)CONCAT44(local_938._12_4_,local_938._8_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_918 == (Allocator *)0x0) {
          if ((void *)local_938._0_8_ != (void *)0x0) {
            free((void *)local_938._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_918 + 0x18))();
        }
      }
    }
  }
  return iVar23;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                if (activation_type == 1)
                {
                    sum = std::max(sum, 0.f);
                }
                else if (activation_type == 2)
                {
                    float slope = activation_params[0];
                    sum = sum > 0.f ? sum : sum * slope;
                }
                else if (activation_type == 3)
                {
                    float min = activation_params[0];
                    float max = activation_params[1];
                    if (sum < min)
                        sum = min;
                    if (sum > max)
                        sum = max;
                }
                else if (activation_type == 4)
                {
                    sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}